

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::WriteLengthDelimited
          (internal *this,uint32_t num,StringPiece val,string *s)

{
  size_type val_00;
  const_pointer pcVar1;
  string *s_00;
  undefined4 in_register_00000034;
  string *s_local;
  undefined1 auStack_18 [4];
  uint32_t num_local;
  StringPiece val_local;
  
  _auStack_18 = (char *)CONCAT44(in_register_00000034,num);
  s_00 = (string *)val.length_;
  val_local.ptr_ = val.ptr_;
  WriteVarint((ulong)((int)this * 8 + 2),s_00);
  val_00 = stringpiece_internal::StringPiece::size((StringPiece *)auStack_18);
  WriteVarint(val_00,s_00);
  pcVar1 = stringpiece_internal::StringPiece::data((StringPiece *)auStack_18);
  stringpiece_internal::StringPiece::size((StringPiece *)auStack_18);
  std::__cxx11::string::append((char *)s_00,(ulong)pcVar1);
  return;
}

Assistant:

void WriteLengthDelimited(uint32_t num, StringPiece val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}